

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O3

void __thiscall
GraphMaker::new_graph_from_kmerlist_128
          (GraphMaker *this,vector<unsigned___int128,_std::allocator<unsigned___int128>_> *kmerlist,
          uint8_t k)

{
  ulong *puVar1;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  SequenceDistanceGraph *pSVar4;
  uint uVar5;
  undefined1 kmer [16];
  undefined1 kmer_00 [16];
  undefined1 kmer_01 [16];
  undefined1 kmer_02 [16];
  undefined1 kmer_03 [16];
  undefined1 kmer_04 [16];
  undefined1 kmer_05 [16];
  undefined1 kmer_06 [16];
  undefined1 kmer_07 [16];
  undefined1 kmer_08 [16];
  undefined1 kmer_09 [16];
  undefined1 kmer_10 [16];
  undefined1 kmer_11 [16];
  undefined1 kmer_12 [16];
  undefined1 kmer_13 [16];
  undefined1 kmer_14 [16];
  unsigned___int128 uVar6;
  pointer ppVar7;
  _Bit_type *p_Var8;
  byte bVar9;
  uint uVar10;
  ostream *poVar11;
  ulong uVar12;
  __uint128_t *p_Var13;
  ulong uVar14;
  ulong uVar15;
  __uint128_t *p_Var16;
  pointer puVar17;
  pointer pNVar18;
  pointer ppVar19;
  byte bVar20;
  int iVar21;
  difference_type __d_10;
  pointer puVar22;
  ulong uVar23;
  pointer ppVar24;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  long lVar25;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  pointer puVar26;
  pointer ppVar27;
  difference_type __n;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  pointer pkVar32;
  vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>> *this_00
  ;
  difference_type __d_11;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  ulong uVar36;
  _Bit_type *p_Var37;
  pointer ppVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  string s;
  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  out;
  array<unsigned___int128,_4UL> bns;
  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  in;
  vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
  last;
  vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
  first;
  vector<kcontext,_std::allocator<kcontext>_> kcontextlist;
  CStringKMerFactory128 skf_ovl;
  pointer in_stack_fffffffffffffae8;
  long lVar42;
  uint in_stack_fffffffffffffaf0;
  undefined4 uVar43;
  undefined4 in_stack_fffffffffffffaf4;
  undefined4 uVar44;
  ulong local_508;
  ulong local_500;
  int local_4d0;
  undefined1 *local_4c8;
  long local_4c0;
  undefined1 local_4b8;
  undefined7 uStack_4b7;
  _Bit_type *local_4a8;
  __uint128_t *local_4a0;
  ulong local_498;
  unsigned_long local_490;
  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  local_488;
  _Bit_type *local_470;
  undefined1 local_468 [16];
  __uint128_t *local_458 [2];
  __uint128_t *local_448;
  undefined8 local_440;
  __uint128_t *local_438;
  undefined8 local_430;
  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  local_428;
  ulong local_408;
  vector<bool,_std::allocator<bool>_> local_400;
  undefined1 local_3d8 [16];
  pointer local_3c8;
  undefined1 local_3b8 [16];
  pointer local_3a8;
  vector<kcontext,_std::allocator<kcontext>_> local_398;
  vector<bool,_std::allocator<bool>_> local_380;
  vector<bool,_std::allocator<bool>_> local_358;
  Node local_330;
  Node local_2f8;
  Node local_2c0;
  undefined1 local_288 [16];
  undefined1 auStack_278 [16];
  __uint128_t *p_Stack_268;
  undefined8 local_260;
  __uint128_t *local_258;
  ulong local_250;
  long local_248;
  long local_240;
  undefined1 local_238 [65];
  char local_1f7;
  char local_1f5;
  char local_1f1;
  char local_1e4;
  char local_1d7;
  char local_1d5;
  char local_1d1;
  char local_1c4;
  undefined1 local_148 [16];
  undefined1 local_138 [65];
  char local_f7;
  char local_f5;
  char local_f1;
  char local_e4;
  char local_d7;
  char local_d5;
  char local_d1;
  char local_c4;
  undefined1 local_48 [16];
  
  std::vector<Node,_std::allocator<Node>_>::_M_erase_at_end
            (&this->sg->nodes,
             (this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ::_M_erase_at_end(&(this->sg->super_DistanceGraph).links,
                    (this->sg->super_DistanceGraph).links.
                    super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->sg->oldnames,
                    (this->sg->oldnames).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pSVar4 = this->sg;
  local_288._0_8_ = auStack_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"");
  paVar3 = &local_2c0.sequence.field_2;
  local_2c0.sequence._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c0,local_288._0_8_,(pointer)(local_288._0_8_ + local_288._8_8_));
  local_2c0.status = Deleted;
  local_2c0.support.type = Undefined;
  local_2c0.support.index = 0;
  local_2c0.support.id = 0;
  SequenceDistanceGraph::add_node(pSVar4,&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0.sequence._M_dataplus._M_p != paVar3) {
    operator_delete(local_2c0.sequence._M_dataplus._M_p,
                    local_2c0.sequence.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_288._0_8_ != auStack_278) {
    operator_delete((void *)local_288._0_8_,auStack_278._0_8_ + 1);
  }
  poVar11 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Constructing Graph from ",0x18);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
  uVar5 = (uint)k;
  uVar35 = 3 - (k < 100);
  if (k < 10) {
    uVar35 = 1;
  }
  local_288._0_8_ = auStack_278;
  std::__cxx11::string::_M_construct((ulong)local_288,(char)uVar35);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_288._0_8_,uVar35,(uint)k);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,(char *)local_288._0_8_,local_288._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"-mers",5);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  if ((undefined1 *)local_288._0_8_ != auStack_278) {
    operator_delete((void *)local_288._0_8_,auStack_278._0_8_ + 1);
  }
  local_4c8 = &local_4b8;
  local_4c0 = 0;
  local_4b8 = 0;
  std::__cxx11::string::reserve((ulong)&local_4c8);
  local_288._0_8_ = local_288._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_400,
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 4,(bool *)local_288,
             (allocator_type *)local_468);
  std::vector<kcontext,_std::allocator<kcontext>_>::vector
            (&local_398,
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)local_288);
  local_288._0_8_ = local_288._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_380,
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 4,(bool *)local_288,
             (allocator_type *)local_468);
  local_288._0_8_ = local_288._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_358,
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 4,(bool *)local_288,
             (allocator_type *)local_468);
  poVar11 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Finding neighbours",0x12);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  puVar17 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar17) {
    bVar9 = k * '\x02';
    uVar36 = -1L << (bVar9 & 0x3f);
    uVar31 = uVar36;
    uVar30 = -1L << (bVar9 & 0x3f) | 0xffffffffffffffffU >> 0x40 - (bVar9 & 0x3f);
    if ((bVar9 & 0x40) != 0) {
      uVar31 = 0;
      uVar30 = uVar36;
    }
    bVar9 = k * '\x02' - 2;
    uVar36 = 0;
    do {
      local_500 = uVar36;
      pkVar32 = local_398.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_4a0 = (__uint128_t *)(local_500 * 0x10);
      uVar6 = puVar17[local_500];
      lVar25 = ((long *)((long)puVar17 + 8))[local_500 * 2];
      uVar12 = (ulong)uVar6 * 4;
      uVar36 = 0;
      uVar29 = 0;
      do {
        *(ulong *)(local_288 + uVar29 * 0x10) = uVar12 + uVar29 & ~uVar31;
        *(ulong *)(local_288 + uVar29 * 0x10 + 8) =
             (lVar25 << 2 | (ulong)uVar6 >> 0x3e) + uVar36 + (ulong)CARRY8(uVar12,uVar29) & ~uVar30;
        bVar39 = uVar36 < (uVar29 < 3);
        uVar36 = uVar36 + (0xfffffffffffffffe < uVar29);
        uVar29 = uVar29 + 1;
      } while (bVar39);
      *(undefined1 *)
       (local_398.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
        super__Vector_impl_data._M_start + local_500) = 0;
      kmer._8_4_ = in_stack_fffffffffffffaf0;
      kmer._0_8_ = in_stack_fffffffffffffae8;
      kmer._12_4_ = in_stack_fffffffffffffaf4;
      p_Var13 = kmer_cannonical128((__uint128_t *)local_288._0_8_,(__uint128_t)kmer,local_288[8]);
      puVar17 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                )._M_impl.super__Vector_impl_data._M_start;
      puVar26 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      uVar29 = (long)puVar26 - (long)puVar17 >> 4;
      puVar22 = puVar17;
      uVar36 = uVar29;
      while (uVar12 = uVar36, 0 < (long)uVar12) {
        uVar36 = uVar12 >> 1;
        uVar14 = *(ulong *)((long)puVar22 + uVar36 * 0x10 + 8);
        if (uVar14 < extraout_RDX ||
            uVar14 - extraout_RDX < (ulong)(*(__uint128_t **)(puVar22 + uVar36) < p_Var13)) {
          puVar22 = puVar22 + uVar36 + 1;
          uVar36 = ~uVar36 + uVar12;
        }
      }
      if ((puVar22 == puVar26) ||
         (extraout_RDX != *(ulong *)((long)puVar22 + 8) || p_Var13 != *(__uint128_t **)puVar22)) {
        in_stack_fffffffffffffaf0 = 0;
      }
      else {
        *(undefined1 *)(pkVar32 + local_500) = 1;
        puVar17 = (kmerlist->
                  super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        puVar26 = (kmerlist->
                  super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl
                  .super__Vector_impl_data._M_finish;
        uVar29 = (long)puVar26 - (long)puVar17 >> 4;
        in_stack_fffffffffffffaf0 = (uint)CONCAT71((int7)(local_500 >> 8),1);
      }
      kmer_00._8_4_ = in_stack_fffffffffffffaf0;
      kmer_00._0_8_ = puVar26;
      kmer_00._12_4_ = in_stack_fffffffffffffaf4;
      p_Var13 = kmer_cannonical128((__uint128_t *)auStack_278._0_8_,(__uint128_t)kmer_00,
                                   auStack_278[8]);
      uVar36 = uVar29;
      puVar22 = puVar17;
      while (uVar12 = uVar36, 0 < (long)uVar12) {
        uVar36 = uVar12 >> 1;
        uVar14 = *(ulong *)((long)puVar22 + uVar36 * 0x10 + 8);
        if (uVar14 < extraout_RDX_00 ||
            uVar14 - extraout_RDX_00 < (ulong)(*(__uint128_t **)(puVar22 + uVar36) < p_Var13)) {
          puVar22 = puVar22 + uVar36 + 1;
          uVar36 = ~uVar36 + uVar12;
        }
      }
      if ((puVar22 != puVar26) &&
         (extraout_RDX_00 == *(ulong *)((long)puVar22 + 8) && p_Var13 == *(__uint128_t **)puVar22))
      {
        in_stack_fffffffffffffaf0 = in_stack_fffffffffffffaf0 | 2;
        *(char *)(pkVar32 + local_500) = (char)in_stack_fffffffffffffaf0;
        puVar17 = (kmerlist->
                  super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        puVar26 = (kmerlist->
                  super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl
                  .super__Vector_impl_data._M_finish;
        uVar29 = (long)puVar26 - (long)puVar17 >> 4;
      }
      kmer_01._8_4_ = in_stack_fffffffffffffaf0;
      kmer_01._0_8_ = puVar26;
      kmer_01._12_4_ = in_stack_fffffffffffffaf4;
      p_Var13 = kmer_cannonical128(p_Stack_268,(__uint128_t)kmer_01,(uint8_t)local_260);
      uVar36 = uVar29;
      puVar22 = puVar17;
      while (uVar12 = uVar36, 0 < (long)uVar12) {
        uVar36 = uVar12 >> 1;
        uVar14 = *(ulong *)((long)puVar22 + uVar36 * 0x10 + 8);
        if (uVar14 < extraout_RDX_01 ||
            uVar14 - extraout_RDX_01 < (ulong)(*(__uint128_t **)(puVar22 + uVar36) < p_Var13)) {
          puVar22 = puVar22 + uVar36 + 1;
          uVar36 = ~uVar36 + uVar12;
        }
      }
      if ((puVar22 != puVar26) &&
         (extraout_RDX_01 == *(ulong *)((long)puVar22 + 8) && p_Var13 == *(__uint128_t **)puVar22))
      {
        in_stack_fffffffffffffaf0 = in_stack_fffffffffffffaf0 | 4;
        *(char *)(pkVar32 + local_500) = (char)in_stack_fffffffffffffaf0;
        puVar17 = (kmerlist->
                  super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        puVar26 = (kmerlist->
                  super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl
                  .super__Vector_impl_data._M_finish;
        uVar29 = (long)puVar26 - (long)puVar17 >> 4;
      }
      kmer_02._8_4_ = in_stack_fffffffffffffaf0;
      kmer_02._0_8_ = puVar26;
      kmer_02._12_4_ = in_stack_fffffffffffffaf4;
      p_Var13 = kmer_cannonical128(local_258,(__uint128_t)kmer_02,(uint8_t)local_250);
      puVar22 = puVar17;
      while (uVar36 = uVar29, 0 < (long)uVar36) {
        uVar29 = uVar36 >> 1;
        uVar12 = *(ulong *)((long)puVar22 + uVar29 * 0x10 + 8);
        if (uVar12 < extraout_RDX_02 ||
            uVar12 - extraout_RDX_02 < (ulong)(*(__uint128_t **)(puVar22 + uVar29) < p_Var13)) {
          puVar22 = puVar22 + uVar29 + 1;
          uVar29 = ~uVar29 + uVar36;
        }
      }
      if ((puVar22 != puVar26) &&
         (extraout_RDX_02 == *(ulong *)((long)puVar22 + 8) && p_Var13 == *(__uint128_t **)puVar22))
      {
        in_stack_fffffffffffffaf0 = in_stack_fffffffffffffaf0 | 8;
        *(char *)(pkVar32 + local_500) = (char)in_stack_fffffffffffffaf0;
        puVar17 = (kmerlist->
                  super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl
                  .super__Vector_impl_data._M_start;
      }
      uVar36 = *(ulong *)((long)((long)puVar17 + 8) + (long)local_4a0);
      uVar14 = *(ulong *)((long)puVar17 + (long)local_4a0) >> 2 | uVar36 << 0x3e;
      uVar29 = 0;
      uVar12 = 0;
      do {
        uVar33 = uVar12 << (bVar9 & 0x3f);
        bVar39 = (bVar9 & 0x40) != 0;
        uVar15 = uVar29 << (bVar9 & 0x3f) | uVar12 >> 0x40 - (bVar9 & 0x3f);
        if (bVar39) {
          uVar15 = uVar33;
        }
        uVar34 = 0;
        if (!bVar39) {
          uVar34 = uVar33;
        }
        *(ulong *)(local_468 + uVar12 * 0x10) = uVar34 + uVar14;
        *(ulong *)(local_468 + uVar12 * 0x10 + 8) =
             uVar15 + (uVar36 >> 2) + (ulong)CARRY8(uVar34,uVar14);
        bVar39 = uVar29 < (uVar12 < 3);
        uVar29 = uVar29 + (0xfffffffffffffffe < uVar12);
        uVar12 = uVar12 + 1;
      } while (bVar39);
      kmer_03._8_4_ = in_stack_fffffffffffffaf0;
      kmer_03._0_8_ = puVar26;
      kmer_03._12_4_ = in_stack_fffffffffffffaf4;
      p_Var13 = kmer_cannonical128((__uint128_t *)local_468._0_8_,(__uint128_t)kmer_03,local_468[8])
      ;
      in_stack_fffffffffffffae8 =
           (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      uVar29 = (long)in_stack_fffffffffffffae8 - (long)puVar17 >> 4;
      uVar36 = uVar29;
      puVar26 = puVar17;
      while (uVar12 = uVar36, 0 < (long)uVar12) {
        uVar36 = uVar12 >> 1;
        uVar14 = *(ulong *)((long)puVar26 + uVar36 * 0x10 + 8);
        if (uVar14 < extraout_RDX_03 ||
            uVar14 - extraout_RDX_03 < (ulong)(*(__uint128_t **)(puVar26 + uVar36) < p_Var13)) {
          puVar26 = puVar26 + uVar36 + 1;
          uVar36 = ~uVar36 + uVar12;
        }
      }
      if ((puVar26 != in_stack_fffffffffffffae8) &&
         (extraout_RDX_03 == *(ulong *)((long)puVar26 + 8) && p_Var13 == *(__uint128_t **)puVar26))
      {
        in_stack_fffffffffffffaf0 = in_stack_fffffffffffffaf0 | 0x10;
        *(char *)(pkVar32 + local_500) = (char)in_stack_fffffffffffffaf0;
        puVar17 = (kmerlist->
                  super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        in_stack_fffffffffffffae8 =
             (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        uVar29 = (long)in_stack_fffffffffffffae8 - (long)puVar17 >> 4;
      }
      kmer_04._8_4_ = in_stack_fffffffffffffaf0;
      kmer_04._0_8_ = in_stack_fffffffffffffae8;
      kmer_04._12_4_ = in_stack_fffffffffffffaf4;
      p_Var13 = kmer_cannonical128(local_458[0],(__uint128_t)kmer_04,(uint8_t)local_458[1]);
      uVar36 = uVar29;
      puVar26 = puVar17;
      while (uVar12 = uVar36, 0 < (long)uVar12) {
        uVar36 = uVar12 >> 1;
        uVar14 = *(ulong *)((long)puVar26 + uVar36 * 0x10 + 8);
        if (uVar14 < extraout_RDX_04 ||
            uVar14 - extraout_RDX_04 < (ulong)(*(__uint128_t **)(puVar26 + uVar36) < p_Var13)) {
          puVar26 = puVar26 + uVar36 + 1;
          uVar36 = ~uVar36 + uVar12;
        }
      }
      if ((puVar26 != in_stack_fffffffffffffae8) &&
         (extraout_RDX_04 == *(ulong *)((long)puVar26 + 8) && p_Var13 == *(__uint128_t **)puVar26))
      {
        in_stack_fffffffffffffaf0 = in_stack_fffffffffffffaf0 | 0x20;
        *(char *)(pkVar32 + local_500) = (char)in_stack_fffffffffffffaf0;
        puVar17 = (kmerlist->
                  super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        in_stack_fffffffffffffae8 =
             (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        uVar29 = (long)in_stack_fffffffffffffae8 - (long)puVar17 >> 4;
      }
      kmer_05._8_4_ = in_stack_fffffffffffffaf0;
      kmer_05._0_8_ = in_stack_fffffffffffffae8;
      kmer_05._12_4_ = in_stack_fffffffffffffaf4;
      p_Var13 = kmer_cannonical128(local_448,(__uint128_t)kmer_05,(uint8_t)local_440);
      uVar36 = uVar29;
      puVar26 = puVar17;
      while (uVar12 = uVar36, 0 < (long)uVar12) {
        uVar36 = uVar12 >> 1;
        uVar14 = *(ulong *)((long)puVar26 + uVar36 * 0x10 + 8);
        if (uVar14 < extraout_RDX_05 ||
            uVar14 - extraout_RDX_05 < (ulong)(*(__uint128_t **)(puVar26 + uVar36) < p_Var13)) {
          puVar26 = puVar26 + uVar36 + 1;
          uVar36 = ~uVar36 + uVar12;
        }
      }
      if ((puVar26 != in_stack_fffffffffffffae8) &&
         (extraout_RDX_05 == *(ulong *)((long)puVar26 + 8) && p_Var13 == *(__uint128_t **)puVar26))
      {
        in_stack_fffffffffffffaf0 = in_stack_fffffffffffffaf0 | 0x40;
        *(char *)(pkVar32 + local_500) = (char)in_stack_fffffffffffffaf0;
        puVar17 = (kmerlist->
                  super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        in_stack_fffffffffffffae8 =
             (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        uVar29 = (long)in_stack_fffffffffffffae8 - (long)puVar17 >> 4;
      }
      kmer_06._8_4_ = in_stack_fffffffffffffaf0;
      kmer_06._0_8_ = in_stack_fffffffffffffae8;
      kmer_06._12_4_ = in_stack_fffffffffffffaf4;
      p_Var13 = kmer_cannonical128(local_438,(__uint128_t)kmer_06,(uint8_t)local_430);
      uVar36 = uVar29;
      puVar26 = puVar17;
      while (uVar12 = uVar36, 0 < (long)uVar12) {
        uVar36 = uVar12 >> 1;
        uVar14 = *(ulong *)((long)puVar26 + uVar36 * 0x10 + 8);
        if (uVar14 < extraout_RDX_06 ||
            uVar14 - extraout_RDX_06 < (ulong)(*(__uint128_t **)(puVar26 + uVar36) < p_Var13)) {
          puVar26 = puVar26 + uVar36 + 1;
          uVar36 = ~uVar36 + uVar12;
        }
      }
      if ((puVar26 != in_stack_fffffffffffffae8) &&
         (extraout_RDX_06 == *(ulong *)((long)puVar26 + 8) && p_Var13 == *(__uint128_t **)puVar26))
      {
        *(byte *)(pkVar32 + local_500) = (byte)in_stack_fffffffffffffaf0 | 0x80;
        puVar17 = (kmerlist->
                  super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        uVar29 = (long)(kmerlist->
                       super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)puVar17 >> 4;
      }
      uVar36 = local_500 + 1;
    } while (local_500 + 1 < uVar29);
  }
  poVar11 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Marking ends",0xc);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  puVar17 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
            _M_impl.super__Vector_impl_data._M_start;
  lVar25 = (long)(kmerlist->
                 super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar17;
  if (lVar25 != 0) {
    local_500 = lVar25 >> 4;
    bVar20 = (byte)(uVar5 * 2);
    bVar9 = bVar20 & 0x3f;
    uVar35 = uVar5 * 2 - 2;
    local_470 = local_358.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar29 = -1L << (bVar20 & 0x3f);
    uVar36 = 0;
    uVar31 = uVar29;
    uVar30 = -1L << bVar9 | 0xffffffffffffffffU >> 0x40 - bVar9;
    if ((uVar5 * 2 & 0x40) != 0) {
      uVar31 = uVar36;
      uVar30 = uVar29;
    }
    local_4a8 = local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_498 = 0x800000000000003f;
    uVar43 = SUB84(local_398.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
                   super__Vector_impl_data._M_start,0);
    uVar44 = (undefined4)
             ((ulong)local_398.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
                     super__Vector_impl_data._M_start >> 0x20);
    pkVar32 = local_398.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar26 = puVar17;
    do {
      bVar9 = *(byte *)(pkVar32 + uVar36);
      iVar21 = (int)local_4a0;
      if ((bVar9 >> 4 < 9) && ((0x116U >> (uint)(bVar9 >> 4) & 1) != 0)) {
        iVar21 = 0;
        if (((bVar9 & 0x10) == 0) &&
           (((iVar21 = 1, (bVar9 & 0x20) == 0 && (iVar21 = 2, (bVar9 & 0x40) == 0)) &&
            (iVar21 = (int)local_4a0, (char)bVar9 < '\0')))) {
          iVar21 = 3;
        }
        uVar29 = *(ulong *)((long)puVar17 + uVar36 * 0x10 + 8);
        uVar15 = (ulong)puVar17[uVar36] >> 2 | uVar29 << 0x3e;
        uVar12 = 0;
        uVar14 = 0;
        do {
          bVar20 = (byte)uVar35;
          bVar9 = bVar20 & 0x3f;
          uVar34 = uVar14 << (bVar20 & 0x3f);
          bVar39 = (uVar35 & 0x40) != 0;
          uVar33 = uVar12 << bVar9 | uVar14 >> 0x40 - bVar9;
          if (bVar39) {
            uVar33 = uVar34;
          }
          uVar23 = 0;
          if (!bVar39) {
            uVar23 = uVar34;
          }
          *(ulong *)(local_288 + uVar14 * 0x10) = uVar23 + uVar15;
          *(ulong *)(local_288 + uVar14 * 0x10 + 8) =
               uVar33 + (uVar29 >> 2) + (ulong)CARRY8(uVar23,uVar15);
          bVar39 = uVar12 < (uVar14 < 3);
          uVar12 = uVar12 + (0xfffffffffffffffe < uVar14);
          uVar14 = uVar14 + 1;
        } while (bVar39);
        p_Var13 = *(__uint128_t **)(local_288 + (long)iVar21 * 0x10);
        uVar29 = *(ulong *)(local_288 + (long)iVar21 * 0x10 + 8);
        kmer_07._8_4_ = uVar43;
        kmer_07._0_8_ = puVar26;
        kmer_07._12_4_ = uVar44;
        puVar17 = puVar26;
        p_Var16 = kmer_cannonical128(p_Var13,(__uint128_t)kmer_07,(uint8_t)uVar29);
        uVar12 = local_500;
        puVar26 = puVar17;
        while (uVar14 = uVar12, 0 < (long)uVar14) {
          uVar12 = uVar14 >> 1;
          uVar15 = *(ulong *)((long)puVar26 + uVar12 * 0x10 + 8);
          if (uVar15 < extraout_RDX_07 ||
              uVar15 - extraout_RDX_07 < (ulong)(*(__uint128_t **)(puVar26 + uVar12) < p_Var16)) {
            puVar26 = puVar26 + uVar12 + 1;
            uVar12 = ~uVar12 + uVar14;
          }
        }
        pkVar32 = (pointer)CONCAT44(uVar44,uVar43);
        bVar9 = *(byte *)((long)pkVar32 + ((long)puVar26 - (long)puVar17 >> 2));
        puVar26 = puVar17;
        if (uVar29 != extraout_RDX_07 || p_Var13 != p_Var16) {
          bVar9 = bVar9 >> 4;
          if (bVar9 < 9) goto LAB_001c11c2;
          goto LAB_001c11d2;
        }
        bVar9 = bVar9 & 0xf;
        if (8 < bVar9) goto LAB_001c11d2;
LAB_001c11c2:
        if ((0x116U >> bVar9 & 1) == 0) goto LAB_001c11d2;
      }
      else {
LAB_001c11d2:
        uVar29 = uVar36 + 0x3f;
        if (-1 < (long)uVar36) {
          uVar29 = uVar36;
        }
        local_470[((long)uVar29 >> 6) + ((ulong)((uVar36 & local_498) < 0x8000000000000001) - 1)] =
             local_470[((long)uVar29 >> 6) +
                       ((ulong)((uVar36 & local_498) < 0x8000000000000001) - 1)] |
             1L << ((byte)uVar36 & 0x3f);
      }
      local_4a0 = (__uint128_t *)CONCAT44(local_4a0._4_4_,iVar21);
      bVar9 = *(byte *)(pkVar32 + uVar36);
      iVar21 = local_4d0;
      if (((bVar9 & 0xf) < 9) && ((0x116U >> (bVar9 & 0xf) & 1) != 0)) {
        iVar21 = 0;
        if ((((bVar9 & 1) == 0) &&
            ((iVar21 = 1, (bVar9 & 2) == 0 && (iVar21 = 2, (bVar9 & 4) == 0)))) &&
           (iVar21 = local_4d0, (bVar9 & 8) != 0)) {
          iVar21 = 3;
        }
        uVar6 = puVar17[uVar36];
        lVar25 = *(long *)((long)puVar17 + uVar36 * 0x10 + 8);
        uVar14 = (ulong)uVar6 * 4;
        uVar29 = 0;
        uVar12 = 0;
        do {
          *(ulong *)(local_288 + uVar12 * 0x10) = uVar14 + uVar12 & ~uVar31;
          *(ulong *)(local_288 + uVar12 * 0x10 + 8) =
               (lVar25 << 2 | (ulong)uVar6 >> 0x3e) + uVar29 + (ulong)CARRY8(uVar14,uVar12) &
               ~uVar30;
          bVar39 = uVar29 < (uVar12 < 3);
          uVar29 = uVar29 + (0xfffffffffffffffe < uVar12);
          uVar12 = uVar12 + 1;
        } while (bVar39);
        p_Var13 = *(__uint128_t **)(local_288 + (long)iVar21 * 0x10);
        uVar29 = *(ulong *)(local_288 + (long)iVar21 * 0x10 + 8);
        kmer_08._8_4_ = uVar43;
        kmer_08._0_8_ = puVar26;
        kmer_08._12_4_ = uVar44;
        puVar17 = puVar26;
        p_Var16 = kmer_cannonical128(p_Var13,(__uint128_t)kmer_08,(uint8_t)uVar29);
        uVar12 = local_500;
        puVar26 = puVar17;
        while (uVar14 = uVar12, 0 < (long)uVar14) {
          uVar12 = uVar14 >> 1;
          uVar15 = *(ulong *)((long)puVar26 + uVar12 * 0x10 + 8);
          if (uVar15 < extraout_RDX_08 ||
              uVar15 - extraout_RDX_08 < (ulong)(*(__uint128_t **)(puVar26 + uVar12) < p_Var16)) {
            puVar26 = puVar26 + uVar12 + 1;
            uVar12 = ~uVar12 + uVar14;
          }
        }
        pkVar32 = (pointer)CONCAT44(uVar44,uVar43);
        bVar9 = *(byte *)((long)pkVar32 + ((long)puVar26 - (long)puVar17 >> 2));
        puVar26 = puVar17;
        if (uVar29 != extraout_RDX_08 || p_Var13 != p_Var16) {
          if ((bVar9 & 0xf) < 9) {
            uVar10 = bVar9 & 0xf;
            goto LAB_001c138d;
          }
          goto LAB_001c139a;
        }
        uVar10 = (uint)(bVar9 >> 4);
        if (8 < uVar10) goto LAB_001c139a;
LAB_001c138d:
        if ((0x116U >> uVar10 & 1) == 0) goto LAB_001c139a;
      }
      else {
LAB_001c139a:
        uVar29 = uVar36 + 0x3f;
        if (-1 < (long)uVar36) {
          uVar29 = uVar36;
        }
        local_4a8[((long)uVar29 >> 6) + ((ulong)((uVar36 & local_498) < 0x8000000000000001) - 1)] =
             local_4a8[((long)uVar29 >> 6) +
                       ((ulong)((uVar36 & local_498) < 0x8000000000000001) - 1)] |
             1L << ((byte)uVar36 & 0x3f);
      }
      uVar36 = uVar36 + 1;
      local_4d0 = iVar21;
    } while (uVar36 != local_500 + (local_500 == 0));
  }
  poVar11 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Creating unitigs",0x10);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  puVar17 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar17) {
    bVar20 = (byte)(uVar5 * 2);
    bVar9 = bVar20 & 0x3f;
    uVar36 = -1L << (bVar20 & 0x3f);
    uVar31 = uVar36;
    uVar30 = -1L << bVar9 | 0xffffffffffffffffU >> 0x40 - bVar9;
    if ((uVar5 * 2 & 0x40) != 0) {
      uVar31 = 0;
      uVar30 = uVar36;
    }
    p_Var37 = (_Bit_type *)~uVar30;
    local_470 = (_Bit_type *)~uVar31;
    uVar43 = 0x3f;
    uVar44 = 0x80000000;
    uVar30 = 0;
    local_4a8 = p_Var37;
    do {
      p_Var8 = local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p;
      uVar31 = uVar30 + 0x3f;
      if (-1 < (long)uVar30) {
        uVar31 = uVar30;
      }
      lVar25 = (long)uVar31 >> 6;
      lVar28 = lVar25 * 8;
      uVar31 = (ulong)((uVar30 & CONCAT44(uVar44,uVar43)) < 0x8000000000000001);
      uVar36 = 1L << ((byte)uVar30 & 0x3f);
      if ((local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[lVar25 + (uVar31 - 1)] >> (uVar30 & 0x3f) & 1) ==
          0) {
        lVar42 = uVar31 * 8 + -8;
        p_Var13 = *(__uint128_t **)(puVar17 + uVar30);
        uVar29 = *(ulong *)((long)puVar17 + uVar30 * 0x10 + 8);
        uVar12 = uVar30;
        if ((local_358.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[lVar25 + (uVar31 - 1)] & uVar36) == 0) {
          if ((local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p[lVar25 + (uVar31 - 1)] & uVar36) != 0)
          goto LAB_001c15a9;
        }
        else {
          if ((local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p[lVar25 + (uVar31 - 1)] & uVar36) == 0) {
LAB_001c15a9:
            local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[lVar25 + (uVar31 - 1)] =
                 local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [lVar25 + (uVar31 - 1)] | uVar36;
            uVar14 = local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [lVar25 + (uVar31 - 1)];
            local_508 = uVar29;
            if ((uVar14 & uVar36) != 0) {
              if (k == '\0') {
                p_Var16 = (__uint128_t *)0x0;
                local_508 = 0;
              }
              else {
                p_Var16 = (__uint128_t *)0x0;
                local_508 = 0;
                uVar35 = uVar5;
                do {
                  uVar10 = (uint)p_Var13;
                  p_Var13 = (__uint128_t *)((ulong)p_Var13 >> 2 | uVar29 << 0x3e);
                  local_508 = local_508 << 2 | (ulong)p_Var16 >> 0x3e;
                  uVar29 = uVar29 >> 2;
                  p_Var16 = (__uint128_t *)((ulong)(uVar10 & 3) + (long)p_Var16 * 4 ^ 3);
                  uVar35 = uVar35 - 1;
                } while (uVar35 != 0);
              }
              uVar29 = ~uVar36 & uVar14;
              if ((local_358.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [lVar25 + (uVar31 - 1)] & uVar36) != 0) {
                uVar29 = uVar14 | uVar36;
              }
              local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[lVar25 + (uVar31 - 1)] = uVar29;
              local_358.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[lVar25 + (uVar31 - 1)] =
                   local_358.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [lVar25 + (uVar31 - 1)] | uVar36;
              p_Var13 = p_Var16;
            }
            kmer_10._8_4_ = uVar43;
            kmer_10._0_8_ = lVar42;
            kmer_10._12_4_ = uVar44;
            kmer_to_sequence128_abi_cxx11_
                      ((string *)local_288,(__uint128_t)kmer_10,(uint8_t)p_Var13);
            std::__cxx11::string::operator=((string *)&local_4c8,(string *)local_288);
            if ((undefined1 *)local_288._0_8_ != auStack_278) {
              operator_delete((void *)local_288._0_8_,auStack_278._0_8_ + 1);
            }
            if ((*(ulong *)((long)p_Var8 + lVar42 + lVar28) & uVar36) == 0) {
              local_408 = ~uVar36;
              local_498 = uVar30;
              do {
                bVar9 = *(byte *)(local_398.super__Vector_base<kcontext,_std::allocator<kcontext>_>.
                                  _M_impl.super__Vector_impl_data._M_start + uVar30);
                kmer_11._8_4_ = uVar43;
                kmer_11._0_8_ = lVar42;
                kmer_11._12_4_ = uVar44;
                p_Var16 = kmer_cannonical128(p_Var13,(__uint128_t)kmer_11,(uint8_t)local_508);
                if (p_Var16 == p_Var13 && extraout_RDX_09 == local_508) {
                  uVar35 = 0;
                  if ((((bVar9 & 1) == 0) && (uVar35 = 1, (bVar9 & 2) == 0)) &&
                     ((uVar35 = 2, (bVar9 & 4) == 0 && (uVar35 = (uint)local_500, (bVar9 & 8) != 0))
                     )) {
                    uVar35 = 3;
                  }
                }
                else {
                  uVar35 = 3;
                  if (((((bVar9 & 0x10) == 0) && (uVar35 = 2, (bVar9 & 0x20) == 0)) &&
                      (uVar35 = 1, (bVar9 & 0x40) == 0)) &&
                     (uVar35 = (uint)local_500, (char)bVar9 < '\0')) {
                    uVar35 = 0;
                  }
                }
                uVar30 = 0;
                uVar31 = 0;
                do {
                  *(ulong *)(local_288 + uVar31 * 0x10) =
                       (long)p_Var13 * 4 + uVar31 & (ulong)local_470;
                  *(ulong *)(local_288 + uVar31 * 0x10 + 8) =
                       (local_508 << 2 | (ulong)p_Var13 >> 0x3e) + uVar30 +
                       (ulong)CARRY8((long)p_Var13 * 4,uVar31) & (ulong)p_Var37;
                  bVar39 = uVar30 < (uVar31 < 3);
                  uVar30 = uVar30 + (0xfffffffffffffffe < uVar31);
                  uVar31 = uVar31 + 1;
                } while (bVar39);
                p_Var13 = *(__uint128_t **)(local_288 + (long)(int)uVar35 * 0x10);
                local_508 = *(ulong *)(local_288 + (long)(int)uVar35 * 0x10 + 8);
                kmer_12._8_4_ = uVar43;
                kmer_12._0_8_ = lVar42;
                kmer_12._12_4_ = uVar44;
                p_Var16 = kmer_cannonical128(p_Var13,(__uint128_t)kmer_12,(uint8_t)local_508);
                puVar17 = (kmerlist->
                          super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)
                          ._M_impl.super__Vector_impl_data._M_start;
                local_500 = (ulong)uVar35;
                puVar26 = puVar17;
                uVar30 = (long)(kmerlist->
                               super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)puVar17 >> 4;
                while (uVar31 = uVar30, 0 < (long)uVar31) {
                  uVar30 = uVar31 >> 1;
                  uVar29 = *(ulong *)((long)puVar26 + uVar30 * 0x10 + 8);
                  if (uVar29 < extraout_RDX_10 ||
                      uVar29 - extraout_RDX_10 <
                      (ulong)(*(__uint128_t **)(puVar26 + uVar30) < p_Var16)) {
                    puVar26 = puVar26 + uVar30 + 1;
                    uVar30 = ~uVar30 + uVar31;
                  }
                }
                uVar30 = (long)puVar26 - (long)puVar17 >> 4;
                uVar31 = uVar30 + 0x3f;
                if (-1 < (long)uVar30) {
                  uVar31 = uVar30;
                }
                lVar25 = (long)uVar31 >> 6;
                uVar31 = (ulong)((uVar30 & CONCAT44(uVar44,uVar43)) < 0x8000000000000001);
                uVar29 = 1L << ((byte)uVar30 & 0x3f);
                uVar12 = local_498;
                p_Var37 = local_4a8;
                if ((local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [lVar25 + (uVar31 - 1)] >> (uVar30 & 0x3f) & 1) != 0) break;
                local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                [lVar25 + (uVar31 - 1)] =
                     local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [lVar25 + (uVar31 - 1)] | uVar29;
                local_4a0 = p_Var13;
                std::__cxx11::string::push_back((char)&local_4c8);
                uVar14 = *(ulong *)((long)p_Var8 + lVar42 + lVar28);
                p_Var37 = local_358.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                if (extraout_RDX_10 == local_508 && p_Var16 == local_4a0) {
                  p_Var37 = local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                }
                if ((p_Var37[lVar25 + (uVar31 - 1)] & uVar29) == 0) {
                  uVar14 = uVar14 & local_408;
                }
                else {
                  uVar14 = uVar14 | uVar36;
                }
                *(ulong *)((long)p_Var8 + lVar42 + lVar28) = uVar14;
                uVar12 = local_498;
                p_Var13 = local_4a0;
                p_Var37 = local_4a8;
              } while ((uVar14 & uVar36) == 0);
            }
          }
          else {
            kmer_09._8_4_ = uVar43;
            kmer_09._0_8_ = lVar42;
            kmer_09._12_4_ = uVar44;
            kmer_to_sequence128_abi_cxx11_
                      ((string *)local_288,(__uint128_t)kmer_09,(uint8_t)p_Var13);
            std::__cxx11::string::operator=((string *)&local_4c8,(string *)local_288);
            if ((undefined1 *)local_288._0_8_ != auStack_278) {
              operator_delete((void *)local_288._0_8_,auStack_278._0_8_ + 1);
            }
            puVar1 = (ulong *)((long)local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                              + lVar42 + lVar28);
            *puVar1 = *puVar1 | uVar36;
          }
          pSVar4 = this->sg;
          local_2f8.sequence._M_dataplus._M_p = (pointer)&local_2f8.sequence.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2f8,local_4c8,local_4c8 + local_4c0);
          local_2f8.status = Active;
          local_2f8.support.type = Undefined;
          local_2f8.support.index = 0;
          local_2f8.support.id = 0;
          SequenceDistanceGraph::add_node(pSVar4,&local_2f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8.sequence._M_dataplus._M_p != &local_2f8.sequence.field_2) {
            operator_delete(local_2f8.sequence._M_dataplus._M_p,
                            local_2f8.sequence.field_2._M_allocated_capacity + 1);
          }
          bVar39 = Node::is_canonical((this->sg->nodes).
                                      super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                      super__Vector_impl_data._M_finish + -1);
          uVar30 = uVar12;
          if (!bVar39) {
            Node::make_rc((this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                          super__Vector_impl_data._M_finish + -1);
          }
        }
      }
      uVar30 = uVar30 + 1;
      puVar17 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar30 < (ulong)((long)(kmerlist->
                                    super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar17 >> 4
                             ));
  }
  poVar11 = sdglib::OutputLog(INFO,true);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," unitigs",8);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  poVar11 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"doing the circles now",0x15);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  puVar17 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
            _M_impl.super__Vector_impl_data._M_start;
  puVar26 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (puVar26 != puVar17) {
    bVar20 = (byte)(uVar5 * 2);
    bVar9 = bVar20 & 0x3f;
    uVar36 = -1L << (bVar20 & 0x3f);
    uVar31 = uVar36;
    uVar30 = -1L << bVar9 | 0xffffffffffffffffU >> 0x40 - bVar9;
    if ((uVar5 * 2 & 0x40) != 0) {
      uVar31 = 0;
      uVar30 = uVar36;
    }
    uVar36 = 0;
    do {
      uVar29 = uVar36 + 0x3f;
      if (-1 < (long)uVar36) {
        uVar29 = uVar36;
      }
      uVar12 = (ulong)((uVar36 & 0x800000000000003f) < 0x8000000000000001);
      if ((local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[((long)uVar29 >> 6) + (uVar12 - 1)] >>
           (uVar36 & 0x3f) & 1) == 0) {
        uVar43 = (undefined4)uVar36;
        uVar44 = (undefined4)(uVar36 >> 0x20);
        uVar14 = (ulong)puVar17[uVar36];
        uVar15 = *(ulong *)((long)puVar17 + uVar36 * 0x10 + 8);
        local_468 = (undefined1  [16])0x0;
        local_458[0] = (__uint128_t *)0x0;
        local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[((long)uVar29 >> 6) + (uVar12 - 1)] =
             local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[((long)uVar29 >> 6) + (uVar12 - 1)] |
             1L << ((byte)uVar36 & 0x3f);
        kmer_13._8_4_ = uVar43;
        kmer_13._0_8_ = uVar15;
        kmer_13._12_4_ = uVar44;
        kmer_to_sequence128_abi_cxx11_((string *)local_288,(__uint128_t)kmer_13,(uint8_t)uVar14);
        std::__cxx11::string::operator=((string *)&local_4c8,(string *)local_288);
        uVar36 = uVar14;
        uVar29 = uVar15;
        if ((undefined1 *)local_288._0_8_ != auStack_278) {
          operator_delete((void *)local_288._0_8_,auStack_278._0_8_ + 1);
          uVar29 = uVar15;
        }
        while( true ) {
          if (local_468._8_8_ != local_468._0_8_) {
            local_468._8_8_ = local_468._0_8_;
          }
          uVar12 = 0;
          uVar33 = 0;
          do {
            *(ulong *)(local_288 + uVar33 * 0x10) = uVar36 * 4 + uVar33 & ~uVar31;
            *(ulong *)(local_288 + uVar33 * 0x10 + 8) =
                 (uVar15 << 2 | uVar36 >> 0x3e) + uVar12 + (ulong)CARRY8(uVar36 * 4,uVar33) &
                 ~uVar30;
            bVar39 = uVar12 < (uVar33 < 3);
            uVar12 = uVar12 + (0xfffffffffffffffe < uVar33);
            uVar33 = uVar33 + 1;
          } while (bVar39);
          lVar25 = 0;
          do {
            kmer_14._8_4_ = uVar43;
            kmer_14._0_8_ = uVar29;
            kmer_14._12_4_ = uVar44;
            p_Var13 = kmer_cannonical128(*(__uint128_t **)(local_288 + lVar25),(__uint128_t)kmer_14,
                                         (uint8_t)*(undefined8 *)(local_288 + lVar25 + 8));
            puVar17 = (kmerlist->
                      super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            puVar26 = puVar17;
            uVar36 = (long)(kmerlist->
                           super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)puVar17 >> 4;
            while (uVar12 = uVar36, 0 < (long)uVar12) {
              uVar36 = uVar12 >> 1;
              uVar15 = *(ulong *)((long)puVar26 + (uVar36 * 2 + 1) * 8);
              if (uVar15 < extraout_RDX_11 ||
                  uVar15 - extraout_RDX_11 < (ulong)(*(__uint128_t **)(puVar26 + uVar36) < p_Var13))
              {
                puVar26 = puVar26 + uVar36 + 1;
                uVar36 = ~uVar36 + uVar12;
              }
            }
            if (extraout_RDX_11 == *(ulong *)((long)puVar26 + 8) &&
                p_Var13 == *(__uint128_t **)puVar26) {
              local_428.
              super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((long)puVar26 - (long)puVar17 >> 4);
              std::vector<klidxs128,std::allocator<klidxs128>>::
              emplace_back<unsigned__int128_const&,long>
                        ((vector<klidxs128,std::allocator<klidxs128>> *)local_468,
                         (unsigned___int128 *)(local_288 + lVar25),(long *)&local_428);
            }
            lVar25 = lVar25 + 0x10;
          } while (lVar25 != 0x40);
          uVar36 = *(ulong *)local_468._0_8_;
          uVar15 = *(ulong *)(local_468._0_8_ + 8);
          if (uVar36 == uVar14 && uVar15 == uVar29) break;
          uVar12 = *(ulong *)(local_468._0_8_ + 0x10);
          uVar33 = uVar12 + 0x3f;
          if (-1 < (long)uVar12) {
            uVar33 = uVar12;
          }
          local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p
          [((long)uVar33 >> 6) + ((ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) - 1)]
               = local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)uVar33 >> 6) +
                  ((ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                 1L << ((byte)uVar12 & 0x3f);
          std::__cxx11::string::push_back((char)&local_4c8);
        }
        pSVar4 = this->sg;
        local_330.sequence._M_dataplus._M_p = (pointer)&local_330.sequence.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_330,local_4c8,local_4c8 + local_4c0);
        local_330.status = Active;
        local_330.support.type = Undefined;
        local_330.support.index = 0;
        local_330.support.id = 0;
        SequenceDistanceGraph::add_node(pSVar4,&local_330);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330.sequence._M_dataplus._M_p != &local_330.sequence.field_2) {
          operator_delete(local_330.sequence._M_dataplus._M_p,
                          local_330.sequence.field_2._M_allocated_capacity + 1);
        }
        bVar39 = Node::is_canonical((this->sg->nodes).
                                    super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                    super__Vector_impl_data._M_finish + -1);
        if (!bVar39) {
          Node::make_rc((this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                        super__Vector_impl_data._M_finish + -1);
        }
        if ((void *)local_468._0_8_ != (void *)0x0) {
          operator_delete((void *)local_468._0_8_,(long)local_458[0] - local_468._0_8_);
        }
        puVar17 = (kmerlist->
                  super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        puVar26 = (kmerlist->
                  super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl
                  .super__Vector_impl_data._M_finish;
        uVar36 = CONCAT44(uVar44,uVar43);
      }
      uVar36 = uVar36 + 1;
    } while (uVar36 < (ulong)((long)puVar26 - (long)puVar17 >> 4));
  }
  poVar11 = sdglib::OutputLog(INFO,true);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," unitigs",8);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  local_428.
  super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_428.
  super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_428.
  super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_488.
  super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_488.
  super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_488.
  super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>::
  reserve(&local_428,
          ((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x2492492492492492);
  std::
  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>::
  reserve(&local_488,
          ((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x2492492492492492);
  local_288[0] = (char)(uVar5 - 1);
  uVar35 = uVar5 * 2 - 2;
  bVar20 = (byte)uVar35;
  bVar9 = bVar20 & 0x3f;
  uVar31 = -1L << (bVar20 & 0x3f);
  uVar30 = uVar31;
  local_250 = -1L << bVar9 | 0xffffffffffffffffU >> 0x40 - bVar9;
  if ((uVar35 & 0x40) != 0) {
    uVar30 = 0;
    local_250 = uVar31;
  }
  local_250 = ~local_250;
  local_258 = (__uint128_t *)~uVar30;
  stack0xfffffffffffffd80 = (undefined1  [16])0x0;
  stack0xfffffffffffffd90 = (undefined1  [16])0x0;
  local_260 = 0;
  uVar30 = (ulong)((uVar5 - 1 & 0xff) * 2);
  local_248 = uVar30 - 2;
  local_240 = (ulong)(1 < uVar30) - 1;
  local_148 = (undefined1  [16])0x0;
  local_48 = (undefined1  [16])0x0;
  memset(local_238,4,0xff);
  memset(local_138,4,0xff);
  local_1f7 = '\0';
  local_1d7 = '\0';
  local_1f5 = '\x01';
  local_1d5 = '\x01';
  local_1f1 = '\x02';
  local_1d1 = '\x02';
  local_1e4 = '\x03';
  local_1c4 = '\x03';
  local_f7 = '\x03';
  local_d7 = '\x03';
  local_f5 = '\x02';
  local_d5 = '\x02';
  local_f1 = '\x01';
  local_d1 = '\x01';
  local_e4 = '\0';
  local_c4 = '\0';
  local_490 = 1;
  pNVar18 = (this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pNVar18 >> 3) *
                 0x6db6db6db6db6db7)) {
    do {
      local_3b8 = (undefined1  [16])0x0;
      local_3a8 = (pointer)0x0;
      local_3c8 = (pointer)0x0;
      local_3d8 = (undefined1  [16])0x0;
      std::__cxx11::string::substr((ulong)local_468,(ulong)(pNVar18 + local_490));
      CStringKMerFactory128::create_kmers_direction
                ((CStringKMerFactory128 *)local_288,
                 (vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                  *)local_3b8,(char *)local_468._0_8_);
      if ((__uint128_t **)local_468._0_8_ != local_458) {
        operator_delete((void *)local_468._0_8_,(long)local_458[0] + 1);
      }
      this_00 = (vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>
                 *)&local_428;
      if (*(bool *)(local_3b8._0_8_ + 0x10) != false) {
        this_00 = (vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>
                   *)&local_488;
      }
      std::vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>
      ::emplace_back<unsigned__int128&,unsigned_long&>
                (this_00,(unsigned___int128 *)local_3b8._0_8_,&local_490);
      std::__cxx11::string::substr
                ((ulong)local_468,
                 (ulong)((this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                         super__Vector_impl_data._M_start + local_490));
      CStringKMerFactory128::create_kmers_direction
                ((CStringKMerFactory128 *)local_288,
                 (vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                  *)local_3d8,(char *)local_468._0_8_);
      if ((__uint128_t **)local_468._0_8_ != local_458) {
        operator_delete((void *)local_468._0_8_,(long)local_458[0] + 1);
      }
      if (*(bool *)(local_3d8._0_8_ + 0x10) == true) {
        local_468._0_8_ = -local_490;
        std::
        vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>::
        emplace_back<unsigned__int128&,unsigned_long>
                  ((vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>
                    *)&local_428,(unsigned___int128 *)local_3d8._0_8_,(unsigned_long *)local_468);
      }
      else {
        local_468._0_8_ = -local_490;
        std::
        vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>::
        emplace_back<unsigned__int128&,unsigned_long>
                  ((vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>
                    *)&local_488,(unsigned___int128 *)local_3d8._0_8_,(unsigned_long *)local_468);
      }
      if ((pointer)local_3d8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_3d8._0_8_,(long)local_3c8 - local_3d8._0_8_);
      }
      if ((pointer)local_3b8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_3b8._0_8_,(long)local_3a8 - local_3b8._0_8_);
      }
      local_490 = local_490 + 1;
      pNVar18 = (this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (local_490 <
             (ulong)(((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pNVar18 >> 3) *
                    0x6db6db6db6db6db7));
  }
  ppVar7 = local_428.
           super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar19 = local_428.
            super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_428.
      super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_428.
      super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar30 = (long)local_428.
                   super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_428.
                   super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar25 = 0x3f;
    if (uVar30 != 0) {
      for (; uVar30 >> lVar25 == 0; lVar25 = lVar25 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,long>*,std::vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_428.
               super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_428.
               super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar25 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,long>*,std::vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar7,ppVar19);
  }
  ppVar7 = local_488.
           super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar19 = local_488.
            super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_488.
      super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_488.
      super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar30 = (long)local_488.
                   super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_488.
                   super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar25 = 0x3f;
    if (uVar30 != 0) {
      for (; uVar30 >> lVar25 == 0; lVar25 = lVar25 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,long>*,std::vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_488.
               super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_488.
               super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar25 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,long>*,std::vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar7,ppVar19);
  }
  ppVar7 = local_428.
           super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_428.
      super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_428.
      super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar19 = local_488.
              super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar24 = local_488.
              super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar30 = 0;
    ppVar38 = local_428.
              super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar31 = (long)ppVar24 - (long)ppVar19 >> 5;
      if (uVar30 < uVar31) {
        uVar36 = *(ulong *)((long)&ppVar38->first + 8);
        ppVar27 = ppVar19 + uVar30;
        do {
          uVar29 = *(ulong *)((long)&ppVar27->first + 8);
          if (uVar36 <= uVar29 &&
              (ulong)((ulong)ppVar27->first < (ulong)ppVar38->first) <= uVar29 - uVar36)
          goto LAB_001c23d9;
          uVar30 = uVar30 + 1;
          ppVar27 = ppVar27 + 1;
        } while (uVar31 != uVar30);
      }
      else {
LAB_001c23d9:
        bVar39 = uVar30 < uVar31;
        uVar31 = uVar30;
        if (bVar39) {
          ppVar27 = ppVar19 + uVar30;
          auVar40[0] = -((char)ppVar27->first == (char)ppVar38->first);
          auVar40[1] = -(*(char *)((long)&ppVar27->first + 1) ==
                        *(char *)((long)&ppVar38->first + 1));
          auVar40[2] = -(*(char *)((long)&ppVar27->first + 2) ==
                        *(char *)((long)&ppVar38->first + 2));
          auVar40[3] = -(*(char *)((long)&ppVar27->first + 3) ==
                        *(char *)((long)&ppVar38->first + 3));
          auVar40[4] = -(*(char *)((long)&ppVar27->first + 4) ==
                        *(char *)((long)&ppVar38->first + 4));
          auVar40[5] = -(*(char *)((long)&ppVar27->first + 5) ==
                        *(char *)((long)&ppVar38->first + 5));
          auVar40[6] = -(*(char *)((long)&ppVar27->first + 6) ==
                        *(char *)((long)&ppVar38->first + 6));
          auVar40[7] = -(*(char *)((long)&ppVar27->first + 7) ==
                        *(char *)((long)&ppVar38->first + 7));
          auVar40[8] = -(*(char *)((long)&ppVar27->first + 8) ==
                        *(char *)((long)&ppVar38->first + 8));
          auVar40[9] = -(*(char *)((long)&ppVar27->first + 9) ==
                        *(char *)((long)&ppVar38->first + 9));
          auVar40[10] = -(*(char *)((long)&ppVar27->first + 10) ==
                         *(char *)((long)&ppVar38->first + 10));
          auVar40[0xb] = -(*(char *)((long)&ppVar27->first + 0xb) ==
                          *(char *)((long)&ppVar38->first + 0xb));
          auVar40[0xc] = -(*(char *)((long)&ppVar27->first + 0xc) ==
                          *(char *)((long)&ppVar38->first + 0xc));
          auVar40[0xd] = -(*(char *)((long)&ppVar27->first + 0xd) ==
                          *(char *)((long)&ppVar38->first + 0xd));
          auVar40[0xe] = -(*(char *)((long)&ppVar27->first + 0xe) ==
                          *(char *)((long)&ppVar38->first + 0xe));
          auVar40[0xf] = -(*(char *)((long)&ppVar27->first + 0xf) ==
                          *(char *)((long)&ppVar38->first + 0xf));
          if ((ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar40[0xf] >> 7) << 0xf) == 0xffff) {
            ppVar27 = ppVar19 + uVar30;
            lVar25 = uVar30 * 0x20;
            do {
              DistanceGraph::add_link
                        (&this->sg->super_DistanceGraph,ppVar38->second,ppVar27->second,1 - uVar5,
                         (Support)ZEXT816(0));
              uVar30 = uVar30 + 1;
              ppVar19 = local_488.
                        super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar24 = local_488.
                        super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if ((ulong)((long)local_488.
                                super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_488.
                                super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar30) break;
              ppVar27 = local_488.
                        super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar30;
              pcVar2 = (char *)((long)&local_488.
                                       super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].first + lVar25);
              auVar41[0] = -(*pcVar2 == (char)ppVar38->first);
              auVar41[1] = -(pcVar2[1] == *(char *)((long)&ppVar38->first + 1));
              auVar41[2] = -(pcVar2[2] == *(char *)((long)&ppVar38->first + 2));
              auVar41[3] = -(pcVar2[3] == *(char *)((long)&ppVar38->first + 3));
              auVar41[4] = -(pcVar2[4] == *(char *)((long)&ppVar38->first + 4));
              auVar41[5] = -(pcVar2[5] == *(char *)((long)&ppVar38->first + 5));
              auVar41[6] = -(pcVar2[6] == *(char *)((long)&ppVar38->first + 6));
              auVar41[7] = -(pcVar2[7] == *(char *)((long)&ppVar38->first + 7));
              auVar41[8] = -(pcVar2[8] == *(char *)((long)&ppVar38->first + 8));
              auVar41[9] = -(pcVar2[9] == *(char *)((long)&ppVar38->first + 9));
              auVar41[10] = -(pcVar2[10] == *(char *)((long)&ppVar38->first + 10));
              auVar41[0xb] = -(pcVar2[0xb] == *(char *)((long)&ppVar38->first + 0xb));
              auVar41[0xc] = -(pcVar2[0xc] == *(char *)((long)&ppVar38->first + 0xc));
              auVar41[0xd] = -(pcVar2[0xd] == *(char *)((long)&ppVar38->first + 0xd));
              auVar41[0xe] = -(pcVar2[0xe] == *(char *)((long)&ppVar38->first + 0xe));
              auVar41[0xf] = -(pcVar2[0xf] == *(char *)((long)&ppVar38->first + 0xf));
              lVar25 = lVar25 + 0x20;
            } while ((ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
                             (ushort)(auVar41[0xf] >> 7) << 0xf) == 0xffff);
          }
        }
      }
      ppVar38 = ppVar38 + 1;
      uVar30 = uVar31;
    } while (ppVar38 != ppVar7);
  }
  poVar11 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Graph construction finished",0x1b);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  if (local_488.
      super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_488.
                    super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_488.
                          super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_488.
                          super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_428.
      super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_428.
                    super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_428.
                          super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_428.
                          super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_358.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_358.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_358.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_358.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
  }
  if (local_398.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_398.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_398.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
  }
  if (local_4c8 != &local_4b8) {
    operator_delete(local_4c8,CONCAT71(uStack_4b7,local_4b8) + 1);
  }
  return;
}

Assistant:

void GraphMaker::new_graph_from_kmerlist_128(const std::vector<__uint128_t> & kmerlist,uint8_t k) {
    //TODO: add a bloom filter to speed this up
    sg.nodes.clear();
    sg.links.clear();
    sg.oldnames.clear();
    sg.add_node(Node("",NodeStatus::Deleted));
    sdglib::OutputLog()<<"Constructing Graph from "<<kmerlist.size()<<" "<<std::to_string(k)<<"-mers"<<std::endl;
    std::string s;
    s.reserve(1000000); //avoid contig-sequence growth
    std::vector<bool> used_kmers(kmerlist.size());
    std::vector<kcontext> kcontextlist(kmerlist.size());
    std::vector<bool> is_end_fw(kmerlist.size());
    std::vector<bool> is_end_bw(kmerlist.size());
    sdglib::OutputLog()<<"Finding neighbours"<<std::endl;
#pragma omp parallel for
    for (uint64_t i=0;i<kmerlist.size();++i){
        auto fns=kmer_fw_neighbours128(kmerlist[i], k);
        auto &c=kcontextlist[i];
        c.fb.fw=0;
        c.fb.bw=0;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(fns[0],k))) c.sbcont.fA=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(fns[1],k))) c.sbcont.fC=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(fns[2],k))) c.sbcont.fG=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(fns[3],k))) c.sbcont.fT=1;
        auto bns=kmer_bw_neighbours128(kmerlist[i], k);
        if (in_sorted_vector(kmerlist,kmer_cannonical128(bns[0],k))) c.sbcont.bA=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(bns[1],k))) c.sbcont.bC=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(bns[2],k))) c.sbcont.bG=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(bns[3],k))) c.sbcont.bT=1;
    }
    sdglib::OutputLog()<<"Marking ends"<<std::endl;
#pragma omp parallel for
    for (uint64_t i=0;i<kmerlist.size();++i) {
        auto &c=kcontextlist[i];
        if (c.fb.bw!=1 and c.fb.bw!=2 and c.fb.bw!=4 and c.fb.bw!=8 ) {
            is_end_bw[i]=true;
        } else {
            int nn;
            if (c.sbcont.bA) nn=0;
            else if (c.sbcont.bC) nn=1;
            else if (c.sbcont.bG) nn=2;
            else if (c.sbcont.bT) nn=3;
            auto next=kmer_bw_neighbours128(kmerlist[i],k)[nn];
            auto cnext=kmer_cannonical128(next,k);
            auto ni=std::lower_bound(kmerlist.begin(),kmerlist.end(),cnext)-kmerlist.begin();
            auto &nc=kcontextlist[ni];
            if (next==cnext and nc.fb.fw!=1 and nc.fb.fw!=2 and nc.fb.fw!=4 and nc.fb.fw!=8) is_end_bw[i]=true;
            if (next!=cnext and nc.fb.bw!=1 and nc.fb.bw!=2 and nc.fb.bw!=4 and nc.fb.bw!=8) is_end_bw[i]=true;
        }
        if (c.fb.fw!=1 and c.fb.fw!=2 and c.fb.fw!=4 and c.fb.fw!=8 ) {
            is_end_fw[i]=true;
        } else {
            int nn;
            if (c.sbcont.fA) nn=0;
            else if (c.sbcont.fC) nn=1;
            else if (c.sbcont.fG) nn=2;
            else if (c.sbcont.fT) nn=3;
            auto next=kmer_fw_neighbours128(kmerlist[i],k)[nn];
            auto cnext=kmer_cannonical128(next,k);
            auto ni=std::lower_bound(kmerlist.begin(),kmerlist.end(),cnext)-kmerlist.begin();
            auto &nc=kcontextlist[ni];
            if (next==cnext and nc.fb.bw!=1 and nc.fb.bw!=2 and nc.fb.bw!=4 and nc.fb.bw!=8) is_end_fw[i]=true;
            if (next!=cnext and nc.fb.fw!=1 and nc.fb.fw!=2 and nc.fb.fw!=4 and nc.fb.fw!=8) is_end_fw[i]=true;
        }
    }
    sdglib::OutputLog()<<"Creating unitigs"<<std::endl;

    for (uint64_t start_kmer_idx=0;start_kmer_idx<kmerlist.size();++start_kmer_idx) {
        if (used_kmers[start_kmer_idx]) continue; //any kmer can only belong to one unitig.ww

        //Check this k-mer is an end/junction
        auto start_kmer = kmerlist[start_kmer_idx];


        auto end_bw=is_end_bw[start_kmer_idx];
        auto end_fw=is_end_fw[start_kmer_idx];

        if (!end_bw and !end_fw) continue;

        if (end_bw and end_fw) {
            //kmer as unitig
            s=kmer_to_sequence128(start_kmer, k);
            used_kmers[start_kmer_idx] = true;
        } else {
            //unitig start on kmer
            //make sure the unitig starts on FW

            auto current_kmer = start_kmer;
            auto current_idx = start_kmer_idx;
            used_kmers[start_kmer_idx] = true;

            if (end_fw) {
                current_kmer = kmer_reverse128(start_kmer, k);
                std::swap(end_fw,end_bw);
            }

            //Add kmer as unitig
            s=kmer_to_sequence128(current_kmer, k);

            unsigned char nucleotides[4] = {'A', 'C', 'G', 'T'};



            //std::cout<<"Starting sequence construction at kmer "<<kmer_to_sequence128(current_kmer,k)<<std::endl;
            while (!end_fw) {
                //Add end nucleotide, update current_kmer;
                //get_fw_idxs128(fwn, current_kmer, k, kmerlist);
                auto c=kcontextlist[current_idx];
                int nn;
                if (kmer_cannonical128(current_kmer,k)==current_kmer) {
                    if (c.sbcont.fA) nn = 0;
                    else if (c.sbcont.fC) nn = 1;
                    else if (c.sbcont.fG) nn = 2;
                    else if (c.sbcont.fT) nn = 3;
                }
                else{
                    if (c.sbcont.bA) nn = 3;
                    else if (c.sbcont.bC) nn = 2;
                    else if (c.sbcont.bG) nn = 1;
                    else if (c.sbcont.bT) nn = 0;
                }
                current_kmer=kmer_fw_neighbours128(current_kmer,k)[nn];
                auto ccurr=kmer_cannonical128(current_kmer,k);
                current_idx=std::lower_bound(kmerlist.begin(),kmerlist.end(),ccurr)-kmerlist.begin();
                if (used_kmers[current_idx]) break; //this should never happen, since these have ends.
                used_kmers[current_idx]=true;
                s.push_back(nucleotides[current_kmer % 4]);
                if (ccurr==current_kmer) end_fw = is_end_fw[current_idx];
                else end_fw = is_end_bw[current_idx];
            }
        }
        sg.add_node(Node(s));
        if (!sg.nodes.back().is_canonical()) sg.nodes.back().make_rc();//inefficient, but once in a node
    }
    sdglib::OutputLog()<<sg.nodes.size()<<" unitigs"<<std::endl;
    //If there are any perfect circles, they won't have ends, so just pick any unused kmer and go fw till you find the same k-mer fw.
    //(this is going to be even tricker to parallelise)
    sdglib::OutputLog()<<"doing the circles now"<<std::endl;
    for (uint64_t start_kmer_idx=0;start_kmer_idx<kmerlist.size();++start_kmer_idx) {
        if (used_kmers[start_kmer_idx]) continue; //any kmer can only belong to one unitig.ww

        //Check this k-mer is an end/junction
        auto start_kmer = kmerlist[start_kmer_idx];
        std::vector<klidxs128> fwn;
        unsigned char nucleotides[4] = {'A', 'C', 'G', 'T'};
        auto current_kmer = start_kmer;
        used_kmers[start_kmer_idx] = true;
        s=kmer_to_sequence128(current_kmer, k);

        while (true) {
            //Add end nucleotide, update current_kmer;
            get_fw_idxs128(fwn, current_kmer, k, kmerlist);
            current_kmer = fwn[0].kmer;
            if (current_kmer==start_kmer) break;
            used_kmers[fwn[0].idx] = true;
            s.push_back(nucleotides[current_kmer % 4]);
        }
        sg.add_node(Node(s));
        if (!sg.nodes.back().is_canonical()) sg.nodes.back().make_rc();//inefficient, but once in a node
    }
    sdglib::OutputLog()<<sg.nodes.size()<<" unitigs"<<std::endl;

    //save the (k-1)mer in (rev on first k-1 / fw on last k-1) or out ( fw on first k-1 / bw on last k-1)
    std::vector<std::pair<__uint128_t,sgNodeID_t>> in, out;
    in.reserve(2*sg.nodes.size());
    out.reserve(2*sg.nodes.size());
    CStringKMerFactory128 skf_ovl(k-1);
    for (uint64_t nid=1;nid<sg.nodes.size();++nid){
        std::vector<std::pair<__uint128_t,bool>> first,last;
        skf_ovl.create_kmers_direction(first,sg.nodes[nid].sequence.substr(0,k-1).c_str());
        if (first[0].second) out.emplace_back(first[0].first,nid);
        else in.emplace_back(first[0].first,nid);
        skf_ovl.create_kmers_direction(last,sg.nodes[nid].sequence.substr(sg.nodes[nid].sequence.size()-k+1,k-1).c_str());
        if (last[0].second) in.emplace_back(last[0].first,-nid);
        else out.emplace_back(last[0].first,-nid);
    }
    std::sort(in.begin(),in.end());
    std::sort(out.begin(),out.end());
    //connect out->in for all combinations on each kmer
    uint64_t next_out_idx=0;
    for(auto &i:in){
        while(next_out_idx<out.size() and out[next_out_idx].first<i.first) ++next_out_idx;
        for (auto oidx=next_out_idx;oidx<out.size() and out[oidx].first==i.first;++oidx) {
            sg.add_link(i.second,out[oidx].second,-k+1); //no support, although we could add the DBG operation as such
        }
    }
    sdglib::OutputLog()<<"Graph construction finished"<<std::endl;
}